

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_sign(uint8_t *private_key,uint8_t *message_hash,uint hash_size,uint8_t *signature,
             uECC_Curve curve)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uECC_word_t k [4];
  uECC_word_t local_58 [5];
  
  lVar4 = 0x40;
  do {
    uVar1 = (int)curve->num_n_bits + 0x3f;
    uVar2 = (int)curve->num_n_bits + 0x7e;
    if (-1 < (int)uVar1) {
      uVar2 = uVar1;
    }
    iVar3 = uECC_generate_random_int(local_58,curve->n,(wordcount_t)(uVar2 >> 6));
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = uECC_sign_with_k(private_key,message_hash,hash_size,local_58,signature,curve);
    if (iVar3 != 0) {
      return 1;
    }
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  return 0;
}

Assistant:

int uECC_sign(const uint8_t *private_key,
              const uint8_t *message_hash,
              unsigned hash_size,
              uint8_t *signature,
              uECC_Curve curve) {
    uECC_word_t k[uECC_MAX_WORDS];
    uECC_word_t tries;

    for (tries = 0; tries < uECC_RNG_MAX_TRIES; ++tries) {
        if (!uECC_generate_random_int(k, curve->n, BITS_TO_WORDS(curve->num_n_bits))) {
            return 0;
        }

        if (uECC_sign_with_k(private_key, message_hash, hash_size, k, signature, curve)) {
            return 1;
        }
    }
    return 0;
}